

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O1

pair<int,_int> __thiscall
NoMeEdgeCalculator::mixedReadDetermination
          (NoMeEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  pair<int,_int> pVar4;
  AlignmentRecord *this_00;
  pair<int,_int> pVar11;
  pair<int,_int> pVar5;
  pair<int,_int> pVar6;
  pair<int,_int> pVar7;
  pair<int,_int> pVar8;
  pair<int,_int> pVar9;
  pair<int,_int> pVar10;
  
  bVar1 = AlignmentRecord::isSingleEnd(ap1);
  if (bVar1) {
    uVar2 = AlignmentRecord::getStart1(ap1);
    uVar3 = AlignmentRecord::getEnd1(ap2);
    if (uVar3 < uVar2) {
      uVar2 = AlignmentRecord::getEnd1(ap1);
      uVar3 = AlignmentRecord::getStart2(ap2);
      if (uVar2 < uVar3) {
        pVar9.first = 0;
        pVar9.second = 0;
        return pVar9;
      }
    }
    uVar2 = AlignmentRecord::getEnd1(ap1);
    uVar3 = AlignmentRecord::getStart1(ap2);
    if (uVar3 <= uVar2) {
      uVar2 = AlignmentRecord::getStart1(ap1);
      uVar3 = AlignmentRecord::getEnd2(ap2);
      if (uVar2 <= uVar3) {
        uVar2 = AlignmentRecord::getStart1(ap1);
        uVar3 = AlignmentRecord::getEnd1(ap2);
        if (uVar2 < uVar3) {
          uVar2 = AlignmentRecord::getEnd1(ap1);
          uVar3 = AlignmentRecord::getStart2(ap2);
          if (uVar2 < uVar3) {
            pVar6.first = 1;
            pVar6.second = 1;
            return pVar6;
          }
        }
        uVar2 = AlignmentRecord::getStart1(ap1);
        uVar3 = AlignmentRecord::getEnd1(ap2);
        if (uVar3 < uVar2) {
          uVar2 = AlignmentRecord::getEnd1(ap1);
          uVar3 = AlignmentRecord::getStart2(ap2);
          if (uVar3 < uVar2) {
            pVar7.first = 1;
            pVar7.second = 2;
            return pVar7;
          }
        }
        AlignmentRecord::getStart1(ap1);
        AlignmentRecord::getEnd1(ap2);
        pVar11.first = 1;
        pVar11.second = 3;
        this_00 = ap2;
LAB_0015903e:
        AlignmentRecord::getEnd1(ap1);
        AlignmentRecord::getStart2(this_00);
        return pVar11;
      }
    }
  }
  else {
    AlignmentRecord::isPairedEnd(ap1);
    uVar2 = AlignmentRecord::getStart1(ap2);
    uVar3 = AlignmentRecord::getEnd1(ap1);
    if (uVar3 < uVar2) {
      uVar2 = AlignmentRecord::getEnd1(ap2);
      uVar3 = AlignmentRecord::getStart2(ap1);
      if (uVar2 < uVar3) {
        pVar8.first = 0;
        pVar8.second = 0;
        return pVar8;
      }
    }
    uVar2 = AlignmentRecord::getStart1(ap2);
    uVar3 = AlignmentRecord::getEnd2(ap1);
    if (uVar2 <= uVar3) {
      uVar2 = AlignmentRecord::getEnd1(ap2);
      uVar3 = AlignmentRecord::getStart1(ap1);
      if (uVar3 <= uVar2) {
        uVar2 = AlignmentRecord::getStart1(ap2);
        uVar3 = AlignmentRecord::getEnd1(ap1);
        if (uVar2 < uVar3) {
          uVar2 = AlignmentRecord::getEnd1(ap2);
          uVar3 = AlignmentRecord::getStart2(ap1);
          if (uVar2 < uVar3) {
            pVar10.first = 1;
            pVar10.second = 1;
            return pVar10;
          }
        }
        uVar2 = AlignmentRecord::getStart1(ap2);
        uVar3 = AlignmentRecord::getEnd1(ap1);
        if (uVar3 < uVar2) {
          uVar2 = AlignmentRecord::getEnd1(ap2);
          uVar3 = AlignmentRecord::getStart2(ap1);
          if (uVar3 < uVar2) {
            pVar5.first = 2;
            pVar5.second = 1;
            return pVar5;
          }
        }
        AlignmentRecord::getStart1(ap2);
        AlignmentRecord::getEnd2(ap1);
        pVar11.first = 1;
        pVar11.second = 4;
        this_00 = ap1;
        ap1 = ap2;
        goto LAB_0015903e;
      }
    }
  }
  pVar4.first = 0;
  pVar4.second = 0;
  return pVar4;
}

Assistant:

std::pair<int , int> NoMeEdgeCalculator::mixedReadDetermination(const AlignmentRecord & ap1, const AlignmentRecord & ap2) const{

    //ap1 is always the read on top in the figures
    if(ap1.isSingleEnd()){
        if((ap1.getStart1()>ap2.getEnd1())&&(ap1.getEnd1()<ap2.getStart2())){
            //             ------
            //   ---------          ----------
            return std::make_pair(0, 0);
        }else if(ap1.getEnd1()<ap2.getStart1()){
            //  ------
            //              ---------       ----------
            return std::make_pair(0, 0);
        }else if(ap1.getStart1()>ap2.getEnd2()){
            //                              ------
            //  ---------       ----------
            return std::make_pair(0, 0);
        }else if((ap1.getStart1()<ap2.getEnd1())&&(ap1.getEnd1()<ap2.getStart2())){
            //   ----------
            //  --------       -----------
            return std::make_pair(1, 1);
        }else if((ap1.getStart1()>ap2.getEnd1())&&(ap1.getEnd1()>ap2.getStart2())){
            //               ------------
            //   -------        ------------
            return std::make_pair(1, 2);
        }else if((ap1.getStart1()<ap2.getEnd1())&&(ap1.getEnd1()>ap2.getStart2())){
            //       --------------
            //   ---------    ----------
            return std::make_pair(1, 3);
        }

    }else if(ap1.isPairedEnd()){
        if((ap2.getStart1()>ap1.getEnd1())&&(ap2.getEnd1()<ap1.getStart2())){
            //  ----------             ------------
            //             ---------
            return std::make_pair(0, 0);
        }else if(ap2.getStart1()>ap1.getEnd2()){
            //  ----------      ------------
            //                                   ---------
            return std::make_pair(0, 0);
        }else if(ap2.getEnd1()<ap1.getStart1()){
            //                     ----------      ------------
            //    ---------
            return std::make_pair(0, 0);
        }else if((ap2.getStart1()<ap1.getEnd1())&&(ap2.getEnd1()<ap1.getStart2())){
            //   ----------    -------------
            //  --------
            return std::make_pair(1, 1);
        }else if((ap2.getStart1()>ap1.getEnd1())&&(ap2.getEnd1()>ap1.getStart2())){
            // ------------       ------------
            //                  ------------
            return std::make_pair(2, 1);
        }else if((ap2.getStart1()<ap1.getEnd2())&&(ap2.getEnd1()>ap1.getStart2())){
            //  ----------      ------------
            //      -------------------
            return std::make_pair(1, 4);
        }
    }

}